

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::LoopMergeBlock(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  uint32_t uVar1;
  CFG *this_00;
  BasicBlock *this_01;
  Instruction *this_02;
  
  uVar1 = ContainingLoop(this,bb_id);
  if (uVar1 != 0) {
    this_00 = IRContext::cfg(this->context_);
    this_01 = CFG::block(this_00,uVar1);
    this_02 = BasicBlock::GetMergeInst(this_01);
    uVar1 = Instruction::GetSingleWordInOperand(this_02,0);
    return uVar1;
  }
  return 0;
}

Assistant:

uint32_t StructuredCFGAnalysis::LoopMergeBlock(uint32_t bb_id) {
  uint32_t header_id = ContainingLoop(bb_id);
  if (header_id == 0) {
    return 0;
  }

  BasicBlock* header = context_->cfg()->block(header_id);
  Instruction* merge_inst = header->GetMergeInst();
  return merge_inst->GetSingleWordInOperand(kMergeNodeIndex);
}